

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  TestProperty *pTVar2;
  int i;
  string local_c8;
  string local_a8 [8];
  string kProperties;
  string kProperty;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"properties",(allocator<char> *)(kProperties.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kProperties.field_2._M_local_buf + 8),"property",
             (allocator<char> *)&local_c8);
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    poVar1 = std::operator<<(stream,"      <");
    poVar1 = std::operator<<(poVar1,local_a8);
    std::operator<<(poVar1,">\n");
    for (i = 0; i < (int)((ulong)((long)(result->test_properties_).
                                        super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(result->test_properties_).
                                       super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 6); i = i + 1)
    {
      pTVar2 = TestResult::GetTestProperty(result,i);
      poVar1 = std::operator<<(stream,"        <");
      std::operator<<(poVar1,(string *)(kProperties.field_2._M_local_buf + 8));
      poVar1 = std::operator<<(stream," name=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(kProperty.field_2._M_local_buf + 8),(pTVar2->key_)._M_dataplus._M_p,
                 &local_29);
      EscapeXmlAttribute(&local_c8,(string *)(kProperty.field_2._M_local_buf + 8));
      poVar1 = std::operator<<(poVar1,(string *)&local_c8);
      std::operator<<(poVar1,"\"");
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)(kProperty.field_2._M_local_buf + 8));
      poVar1 = std::operator<<(stream," value=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(kProperty.field_2._M_local_buf + 8),(pTVar2->value_)._M_dataplus._M_p,
                 &local_29);
      EscapeXmlAttribute(&local_c8,(string *)(kProperty.field_2._M_local_buf + 8));
      poVar1 = std::operator<<(poVar1,(string *)&local_c8);
      std::operator<<(poVar1,"\"");
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)(kProperty.field_2._M_local_buf + 8));
      std::operator<<(stream,"/>\n");
    }
    poVar1 = std::operator<<(stream,"      </");
    poVar1 = std::operator<<(poVar1,local_a8);
    std::operator<<(poVar1,">\n");
  }
  std::__cxx11::string::~string((string *)(kProperties.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "      <" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "        <" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "      </" << kProperties << ">\n";
}